

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test::testBody
          (TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  MyTypeForTestingCopier local_28;
  MyTypeForTestingCopier copier;
  MyTypeForTesting object;
  TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,1);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_28);
  SimpleString::SimpleString(local_48,"existing");
  mock(local_48,(MockFailureReporter *)0x0);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_68,&local_28);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::SimpleString(&local_78,"existing");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_88);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,&copier);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_b8,"existing");
  pMVar2 = mock(&local_b8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_c8);
  SimpleString::SimpleString(&local_d8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_e8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_d8,&local_e8,&copier);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::SimpleString(&local_f8,"");
  pMVar2 = mock(&local_f8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_f8);
  SimpleString::SimpleString(&local_108,"");
  pMVar2 = mock(&local_108,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_108);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_28);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installCopiersWorksHierarchically)
{
    MyTypeForTesting object(1);
    MyTypeForTestingCopier copier;

    mock("existing");
    mock().installCopier("MyTypeForTesting", copier);
    mock("existing").expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}